

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

bool __thiscall
QTreeModel::dropMimeData
          (QTreeModel *this,QMimeData *data,DropAction action,int row,int column,QModelIndex *parent
          )

{
  code *UNRECOVERED_JUMPTABLE;
  undefined1 uVar1;
  QTreeWidget *pQVar2;
  QTreeWidgetItem *pQVar3;
  
  if ((column & row) == 0xffffffff) {
    row = (**(code **)(*(long *)this + 0x78))(this,parent);
  }
  pQVar2 = view(this);
  pQVar3 = item(this,parent);
  UNRECOVERED_JUMPTABLE =
       *(code **)(*(long *)&(pQVar2->super_QTreeView).super_QAbstractItemView.
                            super_QAbstractScrollArea.super_QFrame.super_QWidget + 800);
  uVar1 = (*UNRECOVERED_JUMPTABLE)(pQVar2,pQVar3,row,data,action,UNRECOVERED_JUMPTABLE);
  return (bool)uVar1;
}

Assistant:

bool QTreeModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                              int row, int column, const QModelIndex &parent)
{
    if (row == -1 && column == -1)
        row = rowCount(parent); // append
    return view()->dropMimeData(item(parent), row, data, action);
}